

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O0

void __thiscall YAML::GraphBuilderAdapter::OnSequenceEnd(GraphBuilderAdapter *this)

{
  void *in_RDI;
  GraphBuilderAdapter *unaff_retaddr;
  void *pSequence;
  
  std::
  stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
  ::top((stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
         *)0xef1fbb);
  std::
  stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
  ::pop((stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
         *)0xef1fd0);
  DispositionNode(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void GraphBuilderAdapter::OnSequenceEnd() {
  void *pSequence = m_containers.top().pContainer;
  m_containers.pop();

  DispositionNode(pSequence);
}